

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  char cVar1;
  int iVar2;
  word x;
  word x_00;
  byte bVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint nWords;
  long lVar16;
  word *pwVar17;
  uint local_c4;
  uint uCanonPhase;
  int *local_b0;
  char *local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  int pStoreIn [17];
  
  bVar3 = (byte)nVars - 6 & 0x1f;
  uVar11 = 1 << bVar3;
  nWords = uVar11;
  if (nVars < 7) {
    nWords = 1;
  }
  local_a8 = pCanonPerm;
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                  ,0x1e2,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *)");
  }
  uVar7 = 0;
  local_a0 = 0;
  if (0 < nVars) {
    local_a0 = (ulong)(uint)nVars;
  }
  for (; local_a0 != uVar7; uVar7 = uVar7 + 1) {
    pCanonPerm[uVar7] = (char)uVar7;
  }
  uVar7 = 0;
  uVar14 = 0;
  if (0 < 1 << bVar3) {
    uVar14 = uVar11;
  }
  uVar15 = (ulong)uVar14;
  if (nVars < 7) {
    uVar15 = 1;
  }
  local_b0 = (int *)((ulong)local_b0 & 0xffffffff00000000);
  for (; uVar15 != uVar7; uVar7 = uVar7 + 1) {
    if (pTruth[uVar7] != 0) {
      iVar5 = Abc_TtCountOnes(pTruth[uVar7]);
      local_b0 = (int *)CONCAT44(local_b0._4_4_,(int)local_b0 + iVar5);
    }
  }
  local_c4 = 0;
  iVar5 = (int)local_b0;
  if ((int)local_b0 != nWords * 0x20 &&
      SBORROW4((int)local_b0,nWords * 0x20) == (int)((int)local_b0 + nWords * -0x20) < 0) {
    Abc_TtNot(pTruth,nWords);
    local_c4 = 1 << ((byte)nVars & 0x1f);
    local_b0 = (int *)CONCAT44(local_b0._4_4_,nWords * 0x40 - iVar5);
  }
  local_90 = (ulong)(uint)nVars;
  if (nVars < 7) {
    piVar10 = pStoreIn;
    lVar13 = local_a0 * 8;
    for (lVar16 = 0; lVar13 - lVar16 != 0; lVar16 = lVar16 + 8) {
      iVar5 = Abc_TtCountOnes(*(ulong *)((long)s_Truths6Neg + lVar16) & *pTruth);
      *piVar10 = iVar5;
      piVar10 = piVar10 + 1;
    }
  }
  else {
    memset(pStoreIn,0,(ulong)(uint)nVars * 4);
    lVar13 = (ulong)(uint)nVars - 6;
    lVar16 = 0;
    while (lVar16 < (int)uVar11) {
      x = pTruth[lVar16];
      x_00 = pTruth[lVar16 + 1];
      pwVar17 = s_Truths6Neg;
      local_98 = lVar16;
      for (lVar8 = 0; lVar4 = local_98, lVar8 != 6; lVar8 = lVar8 + 1) {
        uVar7 = (*pwVar17 & x_00) << ((byte)(1 << ((byte)lVar8 & 0x1f)) & 0x3f) | *pwVar17 & x;
        if (uVar7 != 0) {
          iVar5 = Abc_TtCountOnes(uVar7);
          pStoreIn[lVar8] = pStoreIn[lVar8] + iVar5;
        }
        pwVar17 = pwVar17 + 1;
      }
      if (x != 0) {
        iVar5 = Abc_TtCountOnes(x);
        for (lVar8 = 0; lVar13 != lVar8; lVar8 = lVar8 + 1) {
          if (((uint)lVar4 >> ((uint)lVar8 & 0x1f) & 1) == 0) {
            pStoreIn[lVar8 + 6] = pStoreIn[lVar8 + 6] + iVar5;
          }
        }
      }
      if (x_00 != 0) {
        iVar5 = Abc_TtCountOnes(x_00);
        for (lVar8 = 0; lVar13 != lVar8; lVar8 = lVar8 + 1) {
          if ((((uint)lVar16 | 1) >> ((uint)lVar8 & 0x1f) & 1) == 0) {
            pStoreIn[lVar8 + 6] = pStoreIn[lVar8 + 6] + iVar5;
          }
        }
      }
      lVar16 = lVar4 + 2;
    }
  }
  uVar7 = local_a0;
  lVar13 = (long)(int)local_90;
  iVar5 = (int)local_b0;
  pStoreIn[lVar13] = (int)local_b0;
  for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
    iVar9 = iVar5 - pStoreIn[uVar15];
    if (pStoreIn[uVar15] < iVar9) {
      Abc_TtFlip(pTruth,nWords,(uint)uVar15);
      local_c4 = local_c4 | 1 << ((uint)uVar15 & 0x1f);
      pStoreIn[uVar15] = iVar9;
    }
  }
  iVar9 = (int)local_90;
  iVar5 = 1;
  if (1 < iVar9) {
    iVar5 = iVar9;
  }
  lVar16 = 2;
  uVar7 = 0;
  while (uVar7 != iVar5 - 1) {
    uVar15 = uVar7 + 1 & 0xffffffff;
    lVar8 = lVar16;
    while( true ) {
      uVar11 = (uint)uVar15;
      if (iVar9 <= (int)(uint)lVar8) break;
      uVar14 = (uint)lVar8;
      if (pStoreIn[(int)uVar11] <= pStoreIn[lVar8]) {
        uVar14 = uVar11;
      }
      lVar8 = lVar8 + 1;
      uVar15 = (ulong)uVar14;
    }
    iVar12 = pStoreIn[uVar7];
    iVar2 = pStoreIn[(int)uVar11];
    if (iVar2 < iVar12) {
      cVar1 = local_a8[uVar7];
      local_a8[uVar7] = local_a8[(int)uVar11];
      local_a8[(int)uVar11] = cVar1;
      pStoreIn[uVar7] = iVar2;
      pStoreIn[(int)uVar11] = iVar12;
      local_c4 = local_c4 ^
                 (1 << ((byte)uVar15 & 0x1f) ^ 1 << ((uint)uVar7 & 0x1f)) &
                 -((local_c4 >> ((byte)uVar15 & 0x1f) ^ local_c4 >> ((byte)uVar7 & 0x1f)) & 1);
      Abc_TtSwapVars(pTruth,iVar9,(uint)uVar7,uVar11);
    }
    lVar16 = lVar16 + 1;
    uVar7 = uVar7 + 1;
  }
  local_98 = CONCAT44(local_98._4_4_,iVar9 + -2);
  local_b0 = pStoreIn + (iVar9 - 1U);
  iVar5 = 0;
  uCanonPhase = local_c4;
LAB_003ee3ca:
  if (iVar5 != 5) {
    uVar14 = 0;
    piVar10 = local_b0;
    for (uVar11 = (uint)local_98; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
      if (pStoreIn[uVar11] == *piVar10) {
        uVar6 = Abc_TtCofactorPerm(pTruth,uVar11,nWords,
                                   (uint)(pStoreIn[uVar11] != pStoreIn[lVar13] / 2),local_a8,
                                   &uCanonPhase,1);
        uVar14 = uVar14 | uVar6;
      }
      piVar10 = piVar10 + -1;
    }
    if (uVar14 != 0) {
      uVar11 = 0;
      lVar16 = 1;
      do {
        iVar12 = (int)lVar16 + -1;
        lVar8 = lVar16;
        do {
          if ((int)(iVar9 - 1U) <= lVar8) {
            iVar5 = iVar5 + 1;
            if (uVar11 == 0) {
              return uCanonPhase;
            }
            goto LAB_003ee3ca;
          }
          piVar10 = pStoreIn + lVar8;
          lVar16 = lVar8 + 1;
          iVar12 = iVar12 + 1;
          lVar4 = lVar8 + 1;
          lVar8 = lVar16;
        } while (*piVar10 != pStoreIn[lVar4]);
        uVar14 = Abc_TtCofactorPerm(pTruth,iVar12,nWords,(uint)(*piVar10 != pStoreIn[lVar13] / 2),
                                    local_a8,&uCanonPhase,1);
        uVar11 = uVar11 | uVar14;
      } while( true );
    }
  }
  return uCanonPhase;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}